

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O0

void dic_forEach(dictionary *dic,enumFunc f,void *user)

{
  int iVar1;
  keynode *local_30;
  keynode *k;
  int i;
  void *user_local;
  enumFunc f_local;
  dictionary *dic_local;
  
  k._4_4_ = 0;
  do {
    if (dic->length <= k._4_4_) {
      return;
    }
    if (dic->table[k._4_4_] != (keynode *)0x0) {
      for (local_30 = dic->table[k._4_4_]; local_30 != (keynode *)0x0; local_30 = local_30->next) {
        iVar1 = (*f)(local_30->key,(int)local_30->len,&local_30->value,user);
        if (iVar1 == 0) {
          return;
        }
      }
    }
    k._4_4_ = k._4_4_ + 1;
  } while( true );
}

Assistant:

void dic_forEach(struct dictionary* dic, enumFunc f, void *user) {
	for (int i = 0; i < dic->length; i++) {
		if (dic->table[i] != 0) {
			struct keynode *k = dic->table[i];
			while (k) {
				if (!f(k->key, k->len, &k->value, user)) return;
				k = k->next;
			}
		}
	}
}